

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * duckdb::StringUtil::ExceptionToJSONMap
                   (string *__return_storage_ptr__,ExceptionType type,string *message,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  ulong uVar3;
  long lVar4;
  pointer __src;
  ulong uVar5;
  _Alloc_hider __src_00;
  bool bVar6;
  yyjson_mut_doc *doc;
  ExceptionType extraout_DL;
  ExceptionType type_00;
  ExceptionType extraout_DL_00;
  yyjson_mut_val *pyVar7;
  char *pcVar8;
  yyjson_mut_val *pyVar9;
  yyjson_mut_val *root;
  string except_str;
  
  root = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  type_00 = extraout_DL;
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar1 = &doc->val_pool;
    if ((doc->val_pool).end == (doc->val_pool).cur) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      type_00 = extraout_DL_00;
      if (bVar6) goto LAB_00cde427;
      root = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00cde427:
      root = pyVar1->cur;
      pyVar1->cur = root + 1;
    }
    if (root == (yyjson_mut_val *)0x0) {
      root = (yyjson_mut_val *)0x0;
    }
    else {
      root->tag = 7;
    }
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    doc->root = root;
  }
  Exception::ExceptionTypeToString_abi_cxx11_(&except_str,(Exception *)(ulong)type,type_00);
  __src_00 = except_str._M_dataplus;
  if ((((doc != (yyjson_mut_doc *)0x0) && (root != (yyjson_mut_val *)0x0)) &&
      (except_str._M_dataplus._M_p != (pointer)0x0)) && ((~(uint)root->tag & 7) == 0)) {
    pyVar1 = &doc->val_pool;
    if ((ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18) < 2) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (bVar6) goto LAB_00cde4aa;
      pyVar9 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00cde4aa:
      pyVar9 = pyVar1->cur;
      pyVar1->cur = pyVar9 + 2;
    }
    if (pyVar9 != (yyjson_mut_val *)0x0) {
      uVar3 = root->tag;
      pyVar9->tag = 0xe0d;
      (pyVar9->uni).str = "exception_type";
      pyVar2 = &doc->str_pool;
      if (except_str._M_string_length <
          (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) {
LAB_00cde4f1:
        pcVar8 = pyVar2->cur;
        pyVar2->cur = pcVar8 + except_str._M_string_length + 1;
      }
      else {
        bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                          (pyVar2,&doc->alc,except_str._M_string_length + 1);
        if (bVar6) goto LAB_00cde4f1;
        pcVar8 = (char *)0x0;
      }
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        switchD_015ff80e::default(pcVar8,__src_00._M_p,except_str._M_string_length);
        pcVar8[except_str._M_string_length] = '\0';
      }
      pyVar9[1].uni.ptr = pcVar8;
      if (pcVar8 != (char *)0x0) {
        pyVar9[1].tag = except_str._M_string_length << 8 | 5;
        pyVar7 = pyVar9;
        if (0xff < uVar3) {
          lVar4 = *(long *)((root->uni).u64 + 0x10);
          pyVar7 = *(yyjson_mut_val **)(lVar4 + 0x10);
          *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar9;
        }
        pyVar9[1].next = pyVar7;
        pyVar9->next = pyVar9 + 1;
        (root->uni).str = (char *)pyVar9;
        root->tag = (uVar3 & 0xffffffffffffff00) + (ulong)(byte)root->tag + 0x100;
      }
    }
  }
  if (((doc == (yyjson_mut_doc *)0x0) || (root == (yyjson_mut_val *)0x0)) ||
     ((__src = (message->_M_dataplus)._M_p, __src == (pointer)0x0 || ((~(uint)root->tag & 7) != 0)))
     ) goto LAB_00cde6a0;
  uVar3 = message->_M_string_length;
  pyVar1 = &doc->val_pool;
  if ((ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18) < 2) {
    bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
    if (bVar6) goto LAB_00cde5d5;
    pyVar9 = (yyjson_mut_val *)0x0;
  }
  else {
LAB_00cde5d5:
    pyVar9 = pyVar1->cur;
    pyVar1->cur = pyVar9 + 2;
  }
  if (pyVar9 == (yyjson_mut_val *)0x0) goto LAB_00cde6a0;
  uVar5 = root->tag;
  pyVar9->tag = 0x110d;
  (pyVar9->uni).str = "exception_message";
  pyVar2 = &doc->str_pool;
  if (uVar3 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) {
LAB_00cde618:
    pcVar8 = pyVar2->cur;
    pyVar2->cur = pcVar8 + uVar3 + 1;
  }
  else {
    bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar3 + 1);
    if (bVar6) goto LAB_00cde618;
    pcVar8 = (char *)0x0;
  }
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    switchD_015ff80e::default(pcVar8,__src,uVar3);
    pcVar8[uVar3] = '\0';
  }
  pyVar9[1].uni.ptr = pcVar8;
  if (pcVar8 != (char *)0x0) {
    pyVar9[1].tag = uVar3 << 8 | 5;
    pyVar7 = pyVar9;
    if (0xff < uVar5) {
      lVar4 = *(long *)((root->uni).u64 + 0x10);
      pyVar7 = *(yyjson_mut_val **)(lVar4 + 0x10);
      *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar9;
    }
    pyVar9[1].next = pyVar7;
    pyVar9->next = pyVar9 + 1;
    (root->uni).str = (char *)pyVar9;
    root->tag = (uVar5 & 0xffffffffffffff00) + (ulong)(byte)root->tag + 0x100;
  }
LAB_00cde6a0:
  ToJsonMapInternal(__return_storage_ptr__,map,doc,root);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)except_str._M_dataplus._M_p != &except_str.field_2) {
    operator_delete(except_str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::ExceptionToJSONMap(ExceptionType type, const string &message,
                                      const unordered_map<string, string> &map) {
	D_ASSERT(map.find("exception_type") == map.end());
	D_ASSERT(map.find("exception_message") == map.end());

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	auto except_str = Exception::ExceptionTypeToString(type);
	yyjson_mut_obj_add_strncpy(doc, root, "exception_type", except_str.c_str(), except_str.size());
	yyjson_mut_obj_add_strncpy(doc, root, "exception_message", message.c_str(), message.size());

	return ToJsonMapInternal(map, doc, root);
}